

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QStringList * __thiscall
QStyleSheetStyleSelector::nodeNames(QStyleSheetStyleSelector *this,NodePtr node)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  QMetaObject *pQVar4;
  undefined8 *in_RDX;
  long *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QMetaObject *metaObject;
  QStringList *result;
  parameter_type in_stack_ffffffffffffff68;
  QLatin1String *this_00;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar6;
  QChar local_5c;
  QChar local_5a;
  undefined8 local_58;
  storage_type *local_50;
  undefined1 local_40 [24];
  QLatin1StringView local_28;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_10 = in_RDX;
  uVar2 = (**(code **)(*in_RSI + 0x38))();
  if ((uVar2 & 1) == 0) {
    (**(code **)*local_10)();
    pcVar3 = (char *)QMetaObject::className();
    iVar1 = qstrcmp(pcVar3,"QTipLabel");
    if (iVar1 == 0) {
      local_28 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_RDI);
      QList<QString>::QList<QLatin1String,void>((QList<QString> *)this_00,in_RDI);
    }
    else {
      uVar6 = 0;
      ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      in_RDI->m_data = (char *)&DAT_aaaaaaaaaaaaaaaa;
      in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x455ea2);
      do {
        local_58 = QMetaObject::className();
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)CONCAT17(uVar6,in_stack_ffffffffffffff80),(char **)this_00);
        QVar5.m_data = local_50;
        QVar5.m_size = (qsizetype)local_40;
        QString::fromLatin1(QVar5);
        QChar::QChar<char16_t,_true>(&local_5a,L':');
        QChar::QChar<char16_t,_true>(&local_5c,L'-');
        QString::replace((QChar *)local_40,(QChar *)(ulong)(ushort)local_5a.ucs,
                         (uint)(ushort)local_5c.ucs);
        QList<QString>::operator+=((QList<QString> *)in_RDI,in_stack_ffffffffffffff68);
        QString::~QString((QString *)0x455f25);
        pQVar4 = QMetaObject::superClass((QMetaObject *)0x455f2f);
      } while (pQVar4 != (QMetaObject *)0x0);
    }
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x455e0f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QStringList nodeNames(NodePtr node) const override
    {
        if (isNullNode(node))
            return QStringList();
        const QMetaObject *metaObject = OBJECT_PTR(node)->metaObject();
#if QT_CONFIG(tooltip)
        if (qstrcmp(metaObject->className(), "QTipLabel") == 0)
            return QStringList("QToolTip"_L1);
#endif
        QStringList result;
        do {
            result += QString::fromLatin1(metaObject->className()).replace(u':', u'-');
            metaObject = metaObject->superClass();
        } while (metaObject != nullptr);
        return result;
    }